

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O3

bool __thiscall
cppcms::impl::file_server::check_in_document_root(file_server *this,string *normal,string *real)

{
  pointer pcVar1;
  pointer ppVar2;
  size_type sVar3;
  bool bVar4;
  long lVar5;
  _Alloc_hider this_00;
  ulong uVar6;
  ulong uVar7;
  string root;
  undefined1 local_78 [40];
  undefined1 local_50 [32];
  
  normalize_path(normal);
  local_78._0_8_ = local_78 + 0x10;
  pcVar1 = (this->document_root_)._M_dataplus._M_p;
  this_00._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00._M_p,pcVar1,pcVar1 + (this->document_root_)._M_string_length);
  ppVar2 = (this->alias_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->alias_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2;
  local_78._32_8_ = this;
  if (lVar5 != 0) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      this_00._M_p = ppVar2[uVar6].first._M_dataplus._M_p;
      bVar4 = is_file_prefix((string *)this_00._M_p,(string *)ppVar2[uVar6].first._M_string_length);
      if (bVar4) {
        std::__cxx11::string::_M_assign((string *)local_78);
        std::__cxx11::string::substr((ulong)local_50,(ulong)normal);
        std::__cxx11::string::operator=((string *)normal,(string *)local_50);
        this_00._M_p = (pointer)local_50._0_8_;
        if ((file_server *)local_50._0_8_ != (file_server *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        if (normal->_M_string_length == 0) {
          this_00._M_p = (pointer)normal;
          std::__cxx11::string::_M_replace((ulong)normal,0,(char *)0x0,0x24572a);
        }
        break;
      }
      bVar4 = uVar7 < (ulong)(lVar5 >> 6);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
  }
  if ((normal->_M_string_length == 0) || (*(normal->_M_dataplus)._M_p != '/')) {
LAB_001ea89c:
    bVar4 = false;
  }
  else {
    if (*(bool *)(local_78._32_8_ + 0x99) == true) {
      bVar4 = is_in_root((file_server *)this_00._M_p,normal,(string *)local_78,real);
      if (!bVar4) goto LAB_001ea89c;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     normal);
      std::__cxx11::string::operator=((string *)real,(string *)local_50);
      if ((file_server *)local_50._0_8_ != (file_server *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
      sVar3 = real->_M_string_length;
      if ((sVar3 != 0) && ((real->_M_dataplus)._M_p[sVar3 - 1] == '/')) {
        std::__cxx11::string::resize((ulong)real,(char)sVar3 + -1);
      }
    }
    bVar4 = true;
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  return bVar4;
}

Assistant:

bool file_server::check_in_document_root(std::string normal,std::string &real) 
{
	normalize_path(normal);
	std::string root = document_root_;
	for(unsigned i=0;i<alias_.size();i++) {
		std::string const &ref=alias_[i].first;
		if(is_file_prefix(ref,normal))
		{
			root = alias_[i].second;
			normal = normal.substr(ref.size());
			if(normal.empty())
				normal="/";
			break;
		}
	}
	if(normal.empty())
		return false;
	if(normal[0]!='/')
		return false;
	if(check_symlinks_) {
		if(!is_in_root(normal,root,real))
			return false;
	}
	else {
		real = root + normal;
        // remove trailing '/' from file name
        size_t real_size = real.size();
        if(real_size > 0 && is_directory_separator(real[real_size-1])) {
            real.resize(real_size-1);
        }
	}
	return true;
}